

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

_HashNode * __thiscall SQTable::_Get(SQTable *this,SQObjectPtr *key)

{
  SQHash SVar1;
  SQObject *in_RSI;
  SQTable *in_RDI;
  _HashNode *local_8;
  
  if (in_RSI->_type == OT_NULL) {
    local_8 = (_HashNode *)0x0;
  }
  else if (in_RSI->_type == OT_STRING) {
    local_8 = _GetStr(in_RDI,(in_RSI->_unVal).raw,
                      ((in_RSI->_unVal).pString)->_hash & (ulong)in_RDI->_numofnodes_minus_one);
  }
  else {
    SVar1 = HashObj(in_RSI);
    local_8 = _Get(in_RDI,(SQObjectPtr *)in_RSI,SVar1 & in_RDI->_numofnodes_minus_one);
  }
  return local_8;
}

Assistant:

SQTable::_HashNode *SQTable::_Get(const SQObjectPtr &key) const
{
    if(sq_type(key) == OT_NULL)
        return nullptr;

    if (sq_type(key) == OT_STRING)
        return _GetStr(_rawval(key), _string(key)->_hash & _numofnodes_minus_one);
    else
        return _Get(key, HashObj(key) & _numofnodes_minus_one);
}